

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcICheck.c
# Opt level: O1

int Bmc_PerformISearchOne
              (Gia_Man_t *p,int nFramesMax,int nTimeOut,int fReverse,int fBackTopo,int fVerbose,
              Vec_Int_t *vLits)

{
  int iVar1;
  int iVar2;
  int iVar3;
  lit *begin;
  int iVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  Gia_Man_t *p1;
  Gia_Man_t *pGia;
  Cnf_Dat_t *pCnf;
  sat_solver *s;
  Vec_Int_t *vRegs;
  int *piVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  timespec ts;
  timespec local_70;
  Cnf_Dat_t *local_60;
  Gia_Man_t *local_58;
  long local_50;
  int local_48;
  int local_44;
  ulong local_40;
  Gia_Man_t *local_38;
  
  iVar4 = clock_gettime(3,&local_70);
  if (iVar4 < 0) {
    local_50 = -1;
  }
  else {
    local_50 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
  }
  if (nFramesMax < 1) {
    __assert_fail("nFramesMax > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                  ,0x17d,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  local_48 = fBackTopo;
  if (p->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                  ,0x17e,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  p1 = Gia_ManDup(p);
  iVar4 = 0;
  pGia = Gia_ManMiter(p,p1,0,1,1,0,0);
  Gia_ManStop(p1);
  if (pGia->vCos->nSize - pGia->nRegs != (p->vCos->nSize - p->nRegs) * 2) {
    __assert_fail("Gia_ManPoNum(pMiter) == 2 * Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                  ,0x184,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  if (pGia->nRegs != p->nRegs * 2) {
    __assert_fail("Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                  ,0x185,
                  "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)");
  }
  pCnf = Mf_ManGenerateCnf(pGia,8,0,0,0);
  s = Bmc_DeriveSolver(p,pGia,pCnf,nFramesMax,nTimeOut,iVar4);
  iVar4 = sat_solver_solve(s,vLits->pArray,vLits->pArray + vLits->nSize,0,0,0,0);
  if (iVar4 == 1) {
    printf("I = %4d :  ",(ulong)(uint)nFramesMax);
    puts("Problem is satisfiable.");
    sat_solver_delete(s);
    Cnf_DataFree(pCnf);
    Gia_ManStop(pGia);
    iVar4 = 1;
  }
  else {
    if (iVar4 == 0) {
      vRegs = (Vec_Int_t *)0x0;
      printf("ICheck: Timeout reached after %d seconds.                                                                          \n"
             ,(ulong)(uint)nTimeOut);
      iVar4 = 1;
    }
    else {
      local_58 = pGia;
      if (iVar4 != -1) {
        __assert_fail("status == l_False",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                      ,0x1a9,
                      "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)"
                     );
      }
      iVar4 = p->nRegs;
      uVar14 = (ulong)iVar4;
      local_60 = pCnf;
      if ((long)uVar14 < 1) {
        uVar15 = 0;
      }
      else {
        uVar11 = 0;
        uVar12 = (ulong)(uint)vLits->nSize;
        if (vLits->nSize < 1) {
          uVar12 = uVar11;
        }
        uVar15 = 0;
        do {
          if (uVar12 == uVar11) goto LAB_0051d4ea;
          if (vLits->pArray[uVar11] < 0) goto LAB_0051d509;
          uVar15 = uVar15 + (~vLits->pArray[uVar11] & 1U);
          uVar11 = uVar11 + 1;
        } while (uVar14 != uVar11);
      }
      vRegs = (Vec_Int_t *)malloc(0x10);
      iVar10 = 0x10;
      if (0xe < iVar4 - 1U) {
        iVar10 = iVar4;
      }
      vRegs->nSize = 0;
      vRegs->nCap = iVar10;
      if (iVar10 == 0) {
        piVar9 = (int *)0x0;
      }
      else {
        piVar9 = (int *)malloc((long)iVar10 << 2);
      }
      vRegs->pArray = piVar9;
      vRegs->nSize = iVar4;
      if (0 < iVar4) {
        uVar12 = 0;
        do {
          piVar9[uVar12] = (int)uVar12;
          uVar12 = uVar12 + 1;
        } while (uVar14 != uVar12);
      }
      if (local_48 != 0) {
        Bmc_PerformFindFlopOrder(p,vRegs);
      }
      if ((fReverse != 0) && (iVar4 = vRegs->nSize, 1 < iVar4)) {
        piVar9 = vRegs->pArray;
        iVar10 = -1;
        lVar13 = 0;
        do {
          iVar1 = piVar9[lVar13];
          piVar9[lVar13] = piVar9[iVar4 + iVar10];
          piVar9[vRegs->nSize + iVar10] = iVar1;
          lVar13 = lVar13 + 1;
          iVar4 = vRegs->nSize;
          iVar10 = iVar10 + -1;
        } while (lVar13 < iVar4 / 2);
      }
      pGia = local_58;
      local_40 = (ulong)(uint)nFramesMax;
      if (0 < vRegs->nSize) {
        lVar13 = 0;
        local_44 = fVerbose;
        local_38 = p;
        do {
          uVar8 = vRegs->pArray[lVar13];
          lVar16 = (long)(int)uVar8;
          if ((lVar16 < 0) || (vLits->nSize <= (int)uVar8)) goto LAB_0051d4ea;
          begin = vLits->pArray;
          uVar6 = begin[lVar16];
          if ((int)uVar6 < 0) {
LAB_0051d509:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10d,"int Abc_LitIsCompl(int)");
          }
          if ((uVar6 & 1) == 0) {
            begin[lVar16] = uVar6 | 1;
            iVar4 = sat_solver_solve(s,begin,begin + vLits->nSize,0,0,0,0);
            if (iVar4 == -1) {
              uVar15 = uVar15 - 1;
            }
            else {
              if (iVar4 != 1) {
                if (iVar4 != 0) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/sat/bmc/bmcICheck.c"
                                ,0x1c9,
                                "int Bmc_PerformISearchOne(Gia_Man_t *, int, int, int, int, int, Vec_Int_t *)"
                               );
                }
                printf("ICheck: Timeout reached after %d seconds.                                                                          \n"
                       ,(ulong)(uint)nTimeOut);
                iVar4 = 1;
                pCnf = local_60;
                goto LAB_0051d476;
              }
              if (vLits->nSize <= (int)uVar8) {
LAB_0051d4ea:
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                              ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
              }
              uVar6 = vLits->pArray[lVar16];
              if ((int)uVar6 < 0) {
                __assert_fail("Lit >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                              ,0x10e,"int Abc_LitNot(int)");
              }
              vLits->pArray[lVar16] = uVar6 ^ 1;
            }
            if (fVerbose != 0) {
              iVar4 = pGia->vCos->nSize;
              iVar10 = pGia->vCis->nSize;
              iVar1 = pGia->nObjs;
              iVar2 = p->vCos->nSize;
              iVar3 = p->nRegs;
              iVar5 = sat_solver_nvars(s);
              p = local_38;
              uVar6 = sat_solver_nconflicts(s);
              iVar7 = 0x8eb7d7;
              printf("I = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
                     ((double)(int)uVar15 * 100.0) / (double)p->nRegs,(ulong)uVar8,
                     (ulong)(uint)((~(iVar4 + iVar10) + iVar1) * (nFramesMax + 1)),
                     (ulong)(uint)(iVar2 + iVar3 + iVar5),(ulong)uVar6);
              Abc_Print(iVar7,"%s =","Time");
              iVar10 = 3;
              iVar4 = clock_gettime(3,&local_70);
              if (iVar4 < 0) {
                lVar16 = -1;
              }
              else {
                lVar16 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
              }
              Abc_Print(iVar10,"%9.2f sec\r",(double)(lVar16 - local_50) / 1000000.0);
              fflush(_stdout);
              pGia = local_58;
              fVerbose = local_44;
            }
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < vRegs->nSize);
      }
      uVar14 = local_40;
      if (fVerbose == 0) {
        iVar4 = 0;
        pCnf = local_60;
      }
      else {
        iVar5 = (int)local_40;
        iVar4 = pGia->vCos->nSize;
        iVar10 = pGia->vCis->nSize;
        iVar1 = pGia->nObjs;
        iVar2 = p->vCos->nSize;
        iVar3 = p->nRegs;
        iVar7 = sat_solver_nvars(s);
        uVar8 = sat_solver_nconflicts(s);
        printf("M = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
               ((double)(int)uVar15 * 100.0) / (double)p->nRegs,uVar14 & 0xffffffff,
               (ulong)(uint)((~(iVar4 + iVar10) + iVar1) * (iVar5 + 1)),
               (ulong)(uint)(iVar2 + iVar3 + iVar7),(ulong)uVar8,(ulong)uVar15);
        iVar10 = 3;
        iVar4 = clock_gettime(3,&local_70);
        if (iVar4 < 0) {
          lVar13 = -1;
        }
        else {
          lVar13 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
        }
        lVar13 = lVar13 - local_50;
        iVar4 = 0;
        Abc_Print(iVar10,"%s =","Time");
        Abc_Print(iVar10,"%9.2f sec\n",(double)lVar13 / 1000000.0);
        fflush(_stdout);
        pGia = local_58;
        pCnf = local_60;
      }
    }
LAB_0051d476:
    sat_solver_delete(s);
    Cnf_DataFree(pCnf);
    Gia_ManStop(pGia);
    if (vRegs->pArray != (int *)0x0) {
      free(vRegs->pArray);
      vRegs->pArray = (int *)0x0;
    }
    if (vRegs != (Vec_Int_t *)0x0) {
      free(vRegs);
    }
  }
  return iVar4;
}

Assistant:

int Bmc_PerformISearchOne( Gia_Man_t * p, int nFramesMax, int nTimeOut, int fReverse, int fBackTopo, int fVerbose, Vec_Int_t * vLits )
{
    int fUseOldCnf = 0;
    Gia_Man_t * pMiter, * pTemp;
    Cnf_Dat_t * pCnf;
    sat_solver * pSat;
    Vec_Int_t * vRegs = NULL;
//    Vec_Int_t * vLits;
    int i, Iter, status;
    int nLitsUsed, RetValue = 0;
    abctime clkStart = Abc_Clock();
    assert( nFramesMax > 0 );
    assert( Gia_ManRegNum(p) > 0 );

    // create miter
    pTemp = Gia_ManDup( p );
    pMiter = Gia_ManMiter( p, pTemp, 0, 1, 1, 0, 0 );
    Gia_ManStop( pTemp );
    assert( Gia_ManPoNum(pMiter)  == 2 * Gia_ManPoNum(p) );
    assert( Gia_ManRegNum(pMiter) == 2 * Gia_ManRegNum(p) );
    // derive CNF
    if ( fUseOldCnf )
        pCnf = Cnf_DeriveGiaRemapped( pMiter );
    else
    {
        extern Cnf_Dat_t * Mf_ManGenerateCnf( Gia_Man_t * pGia, int nLutSize, int fCnfObjIds, int fAddOrCla, int fVerbose );
        //pMiter = Jf_ManDeriveCnf( pTemp = pMiter, 0 );
        //Gia_ManStop( pTemp );
        //pCnf = (Cnf_Dat_t *)pMiter->pData; pMiter->pData = NULL;
        pCnf = Mf_ManGenerateCnf( pMiter, 8, 0, 0, 0 );
    }
/*
    // collect positive literals
    vLits = Vec_IntAlloc( Gia_ManCoNum(p) );
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        Vec_IntPush( vLits, Abc_Var2Lit(i, 0) );
*/
    // derive SAT solver        
    pSat = Bmc_DeriveSolver( p, pMiter, pCnf, nFramesMax, nTimeOut, fVerbose );
    status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    if ( status == l_True )
    {
        printf( "I = %4d :  ", nFramesMax );
        printf( "Problem is satisfiable.\n" );
        sat_solver_delete( pSat );
        Cnf_DataFree( pCnf );
        Gia_ManStop( pMiter );
        return 1;
    }
    if ( status == l_Undef )
    {
        printf( "ICheck: Timeout reached after %d seconds.                                                                          \n", nTimeOut );
        RetValue = 1;
        goto cleanup;
    }
    assert( status == l_False );

    // count the number of positive literals
    nLitsUsed = 0;
    for ( i = 0; i < Gia_ManRegNum(p); i++ )
        if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
            nLitsUsed++;

    // try removing variables
    vRegs = Vec_IntStartNatural( Gia_ManRegNum(p) );
    if ( fBackTopo )
        Bmc_PerformFindFlopOrder( p, vRegs );
    if ( fReverse )
        Vec_IntReverseOrder( vRegs );
//    for ( Iter = 0; Iter < Gia_ManRegNum(p); Iter++ )
    Vec_IntForEachEntry( vRegs, i, Iter )
    {
//        i = fReverse ? Gia_ManRegNum(p) - 1 - Iter : Iter;
        if ( Abc_LitIsCompl(Vec_IntEntry(vLits, i)) )
            continue;
        Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits, i)) );
        status = sat_solver_solve( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits), (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
        if ( status == l_Undef )
        {
            printf( "ICheck: Timeout reached after %d seconds.                                                                          \n", nTimeOut );
            RetValue = 1;
            goto cleanup;
        }
        if ( status == l_True )
            Vec_IntWriteEntry( vLits, i, Abc_LitNot(Vec_IntEntry(vLits, i)) );
        else if ( status == l_False )
            nLitsUsed--;
        else assert( 0 );
        // report the results
        //printf( "Round %d:  ", o );
        if ( fVerbose )
        {
            printf( "I = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
                i, (nFramesMax+1) * Gia_ManAndNum(pMiter), 
                Gia_ManRegNum(p) + Gia_ManCoNum(p) + sat_solver_nvars(pSat), 
                sat_solver_nconflicts(pSat), nLitsUsed, 100.0 * nLitsUsed / Gia_ManRegNum(p) );
            ABC_PRTr( "Time", Abc_Clock() - clkStart );
            fflush( stdout );
        }
    }
    // report the results
    //printf( "Round %d:  ", o );
    if ( fVerbose )
    {
        printf( "M = %4d :  AIG =%8d.  SAT vars =%8d.  SAT conf =%8d.  S =%6d. (%6.2f %%)  ",
            nFramesMax, (nFramesMax+1) * Gia_ManAndNum(pMiter), 
            Gia_ManRegNum(p) + Gia_ManCoNum(p) + sat_solver_nvars(pSat), 
            sat_solver_nconflicts(pSat), nLitsUsed, 100.0 * nLitsUsed / Gia_ManRegNum(p) );
        Abc_PrintTime( 1, "Time", Abc_Clock() - clkStart );
        fflush( stdout );
    }
cleanup:
    // cleanup
    sat_solver_delete( pSat );
    Cnf_DataFree( pCnf );
    Gia_ManStop( pMiter );
    Vec_IntFree( vRegs );
//    Vec_IntFree( vLits );
    return RetValue;
}